

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_d.h
# Opt level: O0

VectorD<float,_3> draco::CrossProduct<float>(VectorD<float,_3> *u,VectorD<float,_3> *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Scalar *pSVar4;
  float fVar5;
  VectorD<float,_3> VVar6;
  VectorD<float,_3> *r;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Scalar SVar7;
  
  VectorD<float,_3>::VectorD
            ((VectorD<float,_3> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  fVar1 = *pSVar4;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  fVar2 = *pSVar4;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  SVar7 = *pSVar4;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  fVar5 = SVar7 * *pSVar4;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  *pSVar4 = fVar1 * fVar2 + -fVar5;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  fVar1 = *pSVar4;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  fVar2 = *pSVar4;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  fVar5 = *pSVar4;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  fVar3 = *pSVar4;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  *pSVar4 = fVar1 * fVar2 + -(fVar5 * fVar3);
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  fVar1 = *pSVar4;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  fVar2 = *pSVar4;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  fVar5 = *pSVar4;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  fVar5 = -(fVar5 * *pSVar4);
  VVar6.v_._M_elems[0] = fVar1 * fVar2 + fVar5;
  pSVar4 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)CONCAT44(SVar7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  VVar6.v_._M_elems[1] = 0.0;
  *pSVar4 = VVar6.v_._M_elems[0];
  VVar6.v_._M_elems[2] = fVar5;
  return (VectorD<float,_3>)VVar6.v_._M_elems;
}

Assistant:

VectorD<ScalarT, 3> CrossProduct(const VectorD<ScalarT, 3> &u,
                                 const VectorD<ScalarT, 3> &v) {
  // Preventing accidental use with uint32_t and the like.
  static_assert(std::is_signed<ScalarT>::value,
                "ScalarT must be a signed type. ");
  VectorD<ScalarT, 3> r;
  r[0] = (u[1] * v[2]) - (u[2] * v[1]);
  r[1] = (u[2] * v[0]) - (u[0] * v[2]);
  r[2] = (u[0] * v[1]) - (u[1] * v[0]);
  return r;
}